

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fOcclusionQueryTests.cpp
# Opt level: O0

void deqp::gles3::Functional::generateVertices
               (vector<float,_std::allocator<float>_> *dst,float width,float height,
               int primitiveCount,int verticesPerPrimitive,Random *rnd,float primitiveSize,
               float minZ,float maxZ)

{
  reference pvVar1;
  float max;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 local_54;
  int j;
  float rndY;
  float rndX;
  int i;
  int vertexCount;
  float s;
  float h;
  float w;
  float maxZ_local;
  float minZ_local;
  float primitiveSize_local;
  Random *rnd_local;
  int verticesPerPrimitive_local;
  int primitiveCount_local;
  float height_local;
  float width_local;
  vector<float,_std::allocator<float>_> *dst_local;
  
  max = primitiveSize / 2.0;
  std::vector<float,_std::allocator<float>_>::resize
            (dst,(long)(verticesPerPrimitive * primitiveCount * 4));
  for (rndY = 0.0; (int)rndY < verticesPerPrimitive * primitiveCount; rndY = (float)((int)rndY + 3))
  {
    fVar2 = de::Random::getFloat(rnd,-(width / 2.0),width / 2.0);
    fVar3 = de::Random::getFloat(rnd,-(height / 2.0),height / 2.0);
    for (local_54 = 0; local_54 < verticesPerPrimitive; local_54 = local_54 + 1) {
      fVar4 = de::Random::getFloat(rnd,-max,max);
      pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                         (dst,(long)(((int)rndY + local_54) * 4));
      *pvVar1 = fVar2 + fVar4;
      fVar4 = de::Random::getFloat(rnd,-max,max);
      pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                         (dst,(long)(((int)rndY + local_54) * 4 + 1));
      *pvVar1 = fVar3 + fVar4;
      fVar4 = de::Random::getFloat(rnd,minZ,maxZ);
      pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                         (dst,(long)(((int)rndY + local_54) * 4 + 2));
      *pvVar1 = fVar4;
      pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                         (dst,(long)(((int)rndY + local_54) * 4 + 3));
      *pvVar1 = 1.0;
    }
  }
  return;
}

Assistant:

static void generateVertices (std::vector<float>& dst, float width, float height, int primitiveCount, int verticesPerPrimitive, de::Random rnd, float primitiveSize, float minZ, float maxZ)
{
	float w = width/2.0f;
	float h = height/2.0f;
	float s = primitiveSize/2.0f;

	int vertexCount = verticesPerPrimitive * primitiveCount;
	dst.resize(vertexCount * ELEMENTS_PER_VERTEX);

	for (int i = 0; i < vertexCount; i += 3)			// First loop gets a random point inside unit square
	{
		float rndX = rnd.getFloat(-w, w);
		float rndY = rnd.getFloat(-h, h);

		for (int j = 0; j < verticesPerPrimitive; j++)	// Second loop gets 3 random points within given distance s from (rndX, rndY)
		{
			dst[(i+j)*ELEMENTS_PER_VERTEX    ] = rndX + rnd.getFloat(-s,s);	// x
			dst[(i+j)*ELEMENTS_PER_VERTEX + 1] = rndY + rnd.getFloat(-s,s);	// y
			dst[(i+j)*ELEMENTS_PER_VERTEX + 2] = rnd.getFloat(minZ, maxZ);	// z
			dst[(i+j)*ELEMENTS_PER_VERTEX + 3] = 1.0f;						// w
		}
	}
}